

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractbutton.cpp
# Opt level: O2

void __thiscall QAbstractButtonPrivate::emitClicked(QAbstractButtonPrivate *this)

{
  QAbstractButton *p;
  QButtonGroup *this_00;
  bool bVar1;
  int _t1;
  long in_FS_OFFSET;
  QWeakPointer<QObject> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  p = *(QAbstractButton **)&(this->super_QWidgetPrivate).field_0x8;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.value = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  QPointer<QAbstractButton>::QPointer<void>((QPointer<QAbstractButton> *)&local_38,p);
  QAbstractButton::clicked(p,(bool)((this->field_0x28c & 2) >> 1));
  bVar1 = QPointer::operator_cast_to_bool((QPointer *)&local_38);
  if ((bVar1) && (this_00 = this->group, this_00 != (QButtonGroup *)0x0)) {
    _t1 = QButtonGroup::id(this_00,p);
    QButtonGroup::idClicked(this_00,_t1);
    bVar1 = QPointer::operator_cast_to_bool((QPointer *)&local_38);
    if ((bVar1) && (this->group != (QButtonGroup *)0x0)) {
      QButtonGroup::buttonClicked(this->group,p);
    }
  }
  QWeakPointer<QObject>::~QWeakPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractButtonPrivate::emitClicked()
{
    Q_Q(QAbstractButton);
    QPointer<QAbstractButton> guard(q);
    emit q->clicked(checked);
#if QT_CONFIG(buttongroup)
    if (guard && group) {
        emit group->idClicked(group->id(q));
        if (guard && group)
            emit group->buttonClicked(q);
    }
#endif
}